

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ldst_fp(DisasContext_conflict2 *s,int opsize,TCGv_i32 addr,TCGv_ptr fp,ea_what what,
                int index)

{
  int index_local;
  ea_what what_local;
  TCGv_ptr fp_local;
  TCGv_i32 addr_local;
  int opsize_local;
  DisasContext_conflict2 *s_local;
  
  if (what == EA_STORE) {
    gen_store_fp(s,opsize,addr,fp,index);
  }
  else {
    gen_load_fp(s,opsize,addr,fp,index);
  }
  return;
}

Assistant:

static void gen_ldst_fp(DisasContext *s, int opsize, TCGv addr,
                        TCGv_ptr fp, ea_what what, int index)
{
    if (what == EA_STORE) {
        gen_store_fp(s, opsize, addr, fp, index);
    } else {
        gen_load_fp(s, opsize, addr, fp, index);
    }
}